

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void flatbuffers::GenerateText(Parser *parser,void *flatbuffer,int indent_step,string *_text)

{
  if (parser->root_struct_def != (StructDef *)0x0) {
    std::__cxx11::string::reserve((ulong)_text);
    GenStruct(parser->root_struct_def,(Table *)((ulong)*flatbuffer + (long)flatbuffer),0,indent_step
              ,_text);
    std::__cxx11::string::append((char *)_text);
    return;
  }
  __assert_fail("parser.root_struct_def",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xd9,
                "void flatbuffers::GenerateText(const Parser &, const void *, int, std::string *)");
}

Assistant:

void GenerateText(const Parser &parser, const void *flatbuffer,
                  int indent_step, std::string *_text) {
  std::string &text = *_text;
  assert(parser.root_struct_def);  // call SetRootType()
  text.reserve(1024);   // Reduce amount of inevitable reallocs.
  GenStruct(*parser.root_struct_def,
            GetRoot<Table>(flatbuffer),
            0,
            indent_step,
            _text);
  text += NewLine(indent_step);
}